

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regression.c
# Opt level: O2

void regress_poly(reg_object obj,double *x,double *y,double *res,double *varcovar,double alpha)

{
  uint uVar1;
  double *x_00;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  double dVar7;
  uint local_34;
  
  uVar4 = obj->p - (uint)(obj->intercept == 1);
  if (0 < (int)uVar4) {
    local_34 = obj->N;
    uVar6 = (ulong)(int)local_34;
    x_00 = (double *)malloc(uVar4 * uVar6 * 8);
    uVar2 = 0;
    uVar3 = 0;
    if (0 < (int)local_34) {
      uVar3 = (ulong)local_34;
    }
    for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
      x_00[uVar2] = x[uVar2];
    }
    uVar1 = 1;
    while (uVar1 != uVar4) {
      uVar1 = uVar1 + 1;
      for (lVar5 = 0; lVar5 < (int)uVar6; lVar5 = lVar5 + 1) {
        dVar7 = pow(x[lVar5],(double)uVar1);
        x_00[(int)local_34 + lVar5] = (double)(int)dVar7;
        uVar6 = (ulong)(uint)obj->N;
      }
      local_34 = local_34 + (int)uVar6;
    }
    regress(obj,x_00,y,res,varcovar,alpha);
    free(x_00);
    return;
  }
  printf("The Value of p should be greater than or equal to 2");
  exit(1);
}

Assistant:

void regress_poly(reg_object obj, double *x, double *y, double *res, double *varcovar, double alpha) {
	int polydeg, i, j, sum;
	double *xx;
	/*
	* Performs polynomial regression of the form
	* Y = B0 + B1 * X + B2 * X^2 + ..... + B(p-1) * X ^(p-1)
	*
	* where p is defined as in regular regression
	* p = Number of dependent variables + Independent Variables
	*
	* For p = 3
	* regress_poly calculates coefficients of
	*
	* Y = B0 + B1 * X + B2 * X^2
	*
	*For more information see the functions regress and reg_init
	*/
	if (obj->intercept == 1) {
		polydeg = obj->p - 1;
	}
	else {
		polydeg = obj->p;
	}


	if (polydeg < 1) {
		printf("The Value of p should be greater than or equal to 2");
		exit(1);
	}

	xx = (double*)malloc(sizeof(double) * obj->N * polydeg);
	for (i = 0; i < obj->N; i++)
		xx[i] = x[i];
	sum = obj->N;
	for (i = 1; i < polydeg; ++i) {
		for (j = 0; j < obj->N; ++j) {
			xx[sum + j] = (int)pow((double)x[j], (double)i + 1.);
		}
		sum += obj->N;
	}
	regress(obj, xx, y, res, varcovar, alpha);

	free(xx);
}